

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpainter.cpp
# Opt level: O2

void __thiscall
VPainter::drawBitmap(VPainter *this,VRect *target,VBitmap *bitmap,VRect *source,uint8_t const_alpha)

{
  bool bVar1;
  VSize VVar2;
  VSize VVar3;
  VBrush local_40;
  
  bVar1 = VBitmap::valid(bitmap);
  if (bVar1) {
    local_40.mType = NoBrush;
    local_40.field_1.mColor.a = '\0';
    local_40.field_1.mColor.r = '\0';
    local_40.field_1.mColor.g = '\0';
    local_40.field_1.mColor.b = '\0';
    setBrush(this,&local_40);
    VVar2 = VRect::size(target);
    VVar3 = VRect::size(source);
    if (VVar2 == VVar3) {
      drawBitmapUntransform(this,target,bitmap,source,const_alpha);
    }
  }
  return;
}

Assistant:

void VPainter::drawBitmap(const VRect &target, const VBitmap &bitmap,
                          const VRect &source, uint8_t const_alpha)
{
    if (!bitmap.valid()) return;

    // clear any existing brush data.
    setBrush(VBrush());

    if (target.size() == source.size()) {
        drawBitmapUntransform(target, bitmap, source, const_alpha);
    } else {
        // @TODO scaling
    }
}